

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O0

void start_input_bmp(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  long in_RSI;
  long *in_RDI;
  cd_progress_ptr progress;
  int *_mp_1;
  int *_mp;
  JDIMENSION row_width;
  int bPad;
  int mapentrysize;
  int biClrUsed;
  int biYPelsPerMeter;
  int biXPelsPerMeter;
  uint biCompression;
  unsigned_short biPlanes;
  int biHeight;
  int biWidth;
  int headerSize;
  int bfOffBits;
  U_CHAR bmpinfoheader [64];
  U_CHAR bmpfileheader [14];
  bmp_source_ptr source;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int iVar5;
  bmp_source_ptr in_stack_ffffffffffffff50;
  uint local_98;
  int local_94;
  int local_90;
  int local_8c;
  short local_7a;
  uint local_78;
  uint local_74;
  byte local_68;
  byte local_67;
  byte local_66;
  byte local_65;
  uint local_64;
  uint local_60;
  short local_5c;
  ushort local_5a;
  int local_58;
  int local_50;
  int local_4c;
  int local_48;
  byte local_26;
  byte local_25;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  long local_18;
  long *local_8;
  
  local_8c = 0;
  local_90 = 0;
  local_98 = 0;
  local_18 = in_RSI;
  local_8 = in_RDI;
  sVar3 = fread(&local_26,1,0xe,*(FILE **)(in_RSI + 0x18));
  if (sVar3 != 0xe) {
    *(undefined4 *)(*local_8 + 0x28) = 0x2b;
    (**(code **)*local_8)(local_8);
  }
  if ((uint)local_26 + (uint)local_25 * 0x100 != 0x4d42) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3f0;
    (**(code **)*local_8)(local_8);
  }
  local_94 = (uint)local_1c + (uint)local_1b * 0x100 + (uint)local_1a * 0x10000 +
             (uint)local_19 * 0x1000000;
  sVar3 = fread(&local_68,1,4,*(FILE **)(local_18 + 0x18));
  if (sVar3 != 4) {
    *(undefined4 *)(*local_8 + 0x28) = 0x2b;
    (**(code **)*local_8)(local_8);
  }
  iVar2 = (uint)local_68 + (uint)local_67 * 0x100 + (uint)local_66 * 0x10000 +
          (uint)local_65 * 0x1000000;
  if (((iVar2 < 0xc) || (0x40 < iVar2)) || (local_94 < iVar2 + 0xe)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3eb;
    (**(code **)*local_8)(local_8);
  }
  sVar3 = fread(&local_64,1,(long)(iVar2 + -4),*(FILE **)(local_18 + 0x18));
  if (sVar3 != (long)(iVar2 + -4)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x2b;
    (**(code **)*local_8)(local_8);
  }
  iVar5 = iVar2;
  if (iVar2 == 0xc) {
    local_74 = local_64 & 0xffff;
    local_78 = local_64 >> 0x10;
    local_7a = (short)local_60;
    *(uint *)(local_18 + 0x50) = local_60 >> 0x10;
    in_stack_ffffffffffffff48 = *(int *)(local_18 + 0x50);
    if (in_stack_ffffffffffffff48 == 8) {
      local_90 = 3;
      *(undefined4 *)(*local_8 + 0x28) = 0x3f5;
      *(uint *)(*local_8 + 0x2c) = local_74;
      *(uint *)(*local_8 + 0x30) = local_78;
      (**(code **)(*local_8 + 8))(local_8,1);
    }
    else if ((in_stack_ffffffffffffff48 == 0x18) || (in_stack_ffffffffffffff48 == 0x20)) {
      lVar1 = *local_8;
      *(uint *)(lVar1 + 0x2c) = local_74;
      *(uint *)(lVar1 + 0x30) = local_78;
      *(undefined4 *)(lVar1 + 0x34) = *(undefined4 *)(local_18 + 0x50);
      *(undefined4 *)(*local_8 + 0x28) = 0x3f4;
      (**(code **)(*local_8 + 8))(local_8,1);
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 0x3ea;
      (**(code **)*local_8)(local_8);
    }
  }
  else {
    if ((iVar2 != 0x28) && (iVar2 != 0x40)) {
      *(undefined4 *)(*local_8 + 0x28) = 0x3eb;
      (**(code **)*local_8)(local_8);
      return;
    }
    local_74 = local_64;
    local_78 = local_60;
    local_7a = local_5c;
    *(uint *)(local_18 + 0x50) = (uint)local_5a;
    local_8c = local_48;
    in_stack_ffffffffffffff44 = *(int *)(local_18 + 0x50);
    if (in_stack_ffffffffffffff44 == 8) {
      local_90 = 4;
      *(undefined4 *)(*local_8 + 0x28) = 0x3f3;
      *(uint *)(*local_8 + 0x2c) = local_64;
      *(uint *)(*local_8 + 0x30) = local_60;
      (**(code **)(*local_8 + 8))(local_8,1);
    }
    else if ((in_stack_ffffffffffffff44 == 0x18) || (in_stack_ffffffffffffff44 == 0x20)) {
      lVar1 = *local_8;
      *(uint *)(lVar1 + 0x2c) = local_64;
      *(uint *)(lVar1 + 0x30) = local_60;
      *(undefined4 *)(lVar1 + 0x34) = *(undefined4 *)(local_18 + 0x50);
      *(undefined4 *)(*local_8 + 0x28) = 0x3f2;
      (**(code **)(*local_8 + 8))(local_8,1);
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 0x3ea;
      (**(code **)*local_8)(local_8);
    }
    if (local_58 != 0) {
      *(undefined4 *)(*local_8 + 0x28) = 0x3ee;
      (**(code **)*local_8)(local_8);
    }
    if ((0 < local_50) && (0 < local_4c)) {
      *(short *)(local_8 + 0x25) = (short)((long)local_50 / 100);
      *(short *)((long)local_8 + 0x12a) = (short)((long)local_4c / 100);
      *(undefined1 *)((long)local_8 + 0x126) = 2;
    }
  }
  if (((int)local_74 < 1) || ((int)local_78 < 1)) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3ef;
    (**(code **)*local_8)(local_8);
  }
  if (local_7a != 1) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3ec;
    (**(code **)*local_8)(local_8);
  }
  local_94 = local_94 - (iVar2 + 0xe);
  if (local_90 != 0) {
    if (local_8c < 1) {
      local_8c = 0x100;
    }
    else if (0x100 < local_8c) {
      *(undefined4 *)(*local_8 + 0x28) = 0x3e9;
      (**(code **)*local_8)(local_8);
    }
    uVar4 = (**(code **)(local_8[1] + 0x10))(local_8,1,local_8c,3);
    *(undefined8 *)(local_18 + 0x38) = uVar4;
    *(int *)(local_18 + 0x54) = local_8c;
    read_colormap(in_stack_ffffffffffffff50,iVar5,in_stack_ffffffffffffff48);
    local_94 = local_94 - local_8c * local_90;
  }
  if (local_94 < 0) {
    *(undefined4 *)(*local_8 + 0x28) = 0x3eb;
    (**(code **)*local_8)(local_8);
  }
  while (local_94 = local_94 + -1, -1 < local_94) {
    read_byte((bmp_source_ptr)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  iVar2 = *(int *)(local_18 + 0x50);
  if (iVar2 == 8) {
    if (*(int *)((long)local_8 + 0x3c) == 0) {
      *(undefined4 *)((long)local_8 + 0x3c) = 6;
    }
    if ((*(int *)((long)local_8 + 0x3c) == 2) ||
       ((5 < *(uint *)((long)local_8 + 0x3c) && (*(uint *)((long)local_8 + 0x3c) < 0x10)))) {
      *(int *)(local_8 + 7) = rgb_pixelsize[*(uint *)((long)local_8 + 0x3c)];
    }
    else if (*(int *)((long)local_8 + 0x3c) == 1) {
      *(undefined4 *)(local_8 + 7) = 1;
    }
    else if (*(int *)((long)local_8 + 0x3c) == 4) {
      *(undefined4 *)(local_8 + 7) = 4;
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 9;
      (**(code **)*local_8)(local_8);
    }
    local_98 = local_74;
  }
  else if (iVar2 == 0x18) {
    if (*(int *)((long)local_8 + 0x3c) == 0) {
      *(undefined4 *)((long)local_8 + 0x3c) = 8;
    }
    if ((*(int *)((long)local_8 + 0x3c) == 2) ||
       ((5 < *(uint *)((long)local_8 + 0x3c) && (*(uint *)((long)local_8 + 0x3c) < 0x10)))) {
      *(int *)(local_8 + 7) = rgb_pixelsize[*(uint *)((long)local_8 + 0x3c)];
    }
    else if (*(int *)((long)local_8 + 0x3c) == 4) {
      *(undefined4 *)(local_8 + 7) = 4;
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 9;
      (**(code **)*local_8)(local_8);
    }
    if (0xffffffff < (ulong)((long)(int)local_74 * 3)) {
      *(undefined4 *)(*local_8 + 0x28) = 0x46;
      (**(code **)*local_8)(local_8);
    }
    local_98 = local_74 * 3;
  }
  else if (iVar2 == 0x20) {
    if (*(int *)((long)local_8 + 0x3c) == 0) {
      *(undefined4 *)((long)local_8 + 0x3c) = 0xd;
    }
    if ((*(int *)((long)local_8 + 0x3c) == 2) ||
       ((5 < *(uint *)((long)local_8 + 0x3c) && (*(uint *)((long)local_8 + 0x3c) < 0x10)))) {
      *(int *)(local_8 + 7) = rgb_pixelsize[*(uint *)((long)local_8 + 0x3c)];
    }
    else if (*(int *)((long)local_8 + 0x3c) == 4) {
      *(undefined4 *)(local_8 + 7) = 4;
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 9;
      (**(code **)*local_8)(local_8);
    }
    if (0xffffffff < (ulong)((long)(int)local_74 * 4)) {
      *(undefined4 *)(*local_8 + 0x28) = 0x46;
      (**(code **)*local_8)(local_8);
    }
    local_98 = local_74 << 2;
  }
  else {
    *(undefined4 *)(*local_8 + 0x28) = 0x3ea;
    (**(code **)*local_8)(local_8);
  }
  for (; (local_98 & 3) != 0; local_98 = local_98 + 1) {
  }
  *(uint *)(local_18 + 0x4c) = local_98;
  if (*(int *)(local_18 + 0x58) == 0) {
    uVar4 = (**(code **)local_8[1])(local_8,1,local_98);
    *(undefined8 *)(local_18 + 0x60) = uVar4;
    iVar2 = *(int *)(local_18 + 0x50);
    if (iVar2 == 8) {
      *(code **)(local_18 + 8) = get_8bit_row;
    }
    else if (iVar2 == 0x18) {
      *(code **)(local_18 + 8) = get_24bit_row;
    }
    else if (iVar2 == 0x20) {
      *(code **)(local_18 + 8) = get_32bit_row;
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 0x3ea;
      (**(code **)*local_8)(local_8);
    }
  }
  else {
    uVar4 = (**(code **)(local_8[1] + 0x20))(local_8,1,0,local_98,local_78);
    *(undefined8 *)(local_18 + 0x40) = uVar4;
    *(code **)(local_18 + 8) = preload_image;
    if (local_8[2] != 0) {
      *(int *)(local_8[2] + 0x24) = *(int *)(local_8[2] + 0x24) + 1;
    }
  }
  if (0xffffffff < (ulong)((long)(int)local_74 * (long)(int)local_8[7])) {
    *(undefined4 *)(*local_8 + 0x28) = 0x46;
    (**(code **)*local_8)(local_8);
  }
  uVar4 = (**(code **)(local_8[1] + 0x10))(local_8,1,local_74 * (int)local_8[7]);
  *(undefined8 *)(local_18 + 0x20) = uVar4;
  *(undefined4 *)(local_18 + 0x28) = 1;
  *(undefined4 *)(local_8 + 9) = 8;
  *(uint *)(local_8 + 6) = local_74;
  *(uint *)((long)local_8 + 0x34) = local_78;
  return;
}

Assistant:

METHODDEF(void)
start_input_bmp(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  U_CHAR bmpfileheader[14];
  U_CHAR bmpinfoheader[64];

#define GET_2B(array, offset) \
  ((unsigned short)UCH(array[offset]) + \
   (((unsigned short)UCH(array[offset + 1])) << 8))
#define GET_4B(array, offset) \
  ((unsigned int)UCH(array[offset]) + \
   (((unsigned int)UCH(array[offset + 1])) << 8) + \
   (((unsigned int)UCH(array[offset + 2])) << 16) + \
   (((unsigned int)UCH(array[offset + 3])) << 24))

  int bfOffBits;
  int headerSize;
  int biWidth;
  int biHeight;
  unsigned short biPlanes;
  unsigned int biCompression;
  int biXPelsPerMeter, biYPelsPerMeter;
  int biClrUsed = 0;
  int mapentrysize = 0;         /* 0 indicates no colormap */
  int bPad;
  JDIMENSION row_width = 0;

  /* Read and verify the bitmap file header */
  if (!ReadOK(source->pub.input_file, bmpfileheader, 14))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  if (GET_2B(bmpfileheader, 0) != 0x4D42) /* 'BM' */
    ERREXIT(cinfo, JERR_BMP_NOT);
  bfOffBits = GET_4B(bmpfileheader, 10);
  /* We ignore the remaining fileheader fields */

  /* The infoheader might be 12 bytes (OS/2 1.x), 40 bytes (Windows),
   * or 64 bytes (OS/2 2.x).  Check the first 4 bytes to find out which.
   */
  if (!ReadOK(source->pub.input_file, bmpinfoheader, 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  headerSize = GET_4B(bmpinfoheader, 0);
  if (headerSize < 12 || headerSize > 64 || (headerSize + 14) > bfOffBits)
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  if (!ReadOK(source->pub.input_file, bmpinfoheader + 4, headerSize - 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);

  switch (headerSize) {
  case 12:
    /* Decode OS/2 1.x header (Microsoft calls this a BITMAPCOREHEADER) */
    biWidth = (int)GET_2B(bmpinfoheader, 4);
    biHeight = (int)GET_2B(bmpinfoheader, 6);
    biPlanes = GET_2B(bmpinfoheader, 8);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 10);

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 3;         /* OS/2 uses RGBTRIPLE colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_OS2_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP_OS2, biWidth, biHeight,
               source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    break;
  case 40:
  case 64:
    /* Decode Windows 3.x header (Microsoft calls this a BITMAPINFOHEADER) */
    /* or OS/2 2.x header, which has additional fields that we ignore */
    biWidth = (int)GET_4B(bmpinfoheader, 4);
    biHeight = (int)GET_4B(bmpinfoheader, 8);
    biPlanes = GET_2B(bmpinfoheader, 12);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 14);
    biCompression = GET_4B(bmpinfoheader, 16);
    biXPelsPerMeter = (int)GET_4B(bmpinfoheader, 24);
    biYPelsPerMeter = (int)GET_4B(bmpinfoheader, 28);
    biClrUsed = GET_4B(bmpinfoheader, 32);
    /* biSizeImage, biClrImportant fields are ignored */

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 4;         /* Windows uses RGBQUAD colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP, biWidth, biHeight, source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    if (biCompression != 0)
      ERREXIT(cinfo, JERR_BMP_COMPRESSED);

    if (biXPelsPerMeter > 0 && biYPelsPerMeter > 0) {
      /* Set JFIF density parameters from the BMP data */
      cinfo->X_density = (UINT16)(biXPelsPerMeter / 100); /* 100 cm per meter */
      cinfo->Y_density = (UINT16)(biYPelsPerMeter / 100);
      cinfo->density_unit = 2;  /* dots/cm */
    }
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
    return;
  }

  if (biWidth <= 0 || biHeight <= 0)
    ERREXIT(cinfo, JERR_BMP_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)biWidth * biHeight > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
  if (biPlanes != 1)
    ERREXIT(cinfo, JERR_BMP_BADPLANES);

  /* Compute distance to bitmap data --- will adjust for colormap below */
  bPad = bfOffBits - (headerSize + 14);

  /* Read the colormap, if any */
  if (mapentrysize > 0) {
    if (biClrUsed <= 0)
      biClrUsed = 256;          /* assume it's 256 */
    else if (biClrUsed > 256)
      ERREXIT(cinfo, JERR_BMP_BADCMAP);
    /* Allocate space to store the colormap */
    source->colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)biClrUsed, (JDIMENSION)3);
    source->cmap_length = (int)biClrUsed;
    /* and read it from the file */
    read_colormap(source, (int)biClrUsed, mapentrysize);
    /* account for size of colormap */
    bPad -= biClrUsed * mapentrysize;
  }

  /* Skip any remaining pad bytes */
  if (bPad < 0)                 /* incorrect bfOffBits value? */
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  while (--bPad >= 0) {
    (void)read_byte(source);
  }

  /* Compute row width in file, including padding to 4-byte boundary */
  switch (source->bits_per_pixel) {
  case 8:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_RGB;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_GRAYSCALE)
      cinfo->input_components = 1;
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    row_width = (JDIMENSION)biWidth;
    break;
  case 24:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGR;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 3ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 3;
    break;
  case 32:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGRA;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 4ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 4;
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADDEPTH);
  }
  while ((row_width & 3) != 0) row_width++;
  source->row_width = row_width;

  if (source->use_inversion_array) {
    /* Allocate space for inversion array, prepare for preload pass */
    source->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       row_width, (JDIMENSION)biHeight, (JDIMENSION)1);
    source->pub.get_pixel_rows = preload_image;
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
  } else {
    source->iobuffer = (U_CHAR *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE, row_width);
    switch (source->bits_per_pixel) {
    case 8:
      source->pub.get_pixel_rows = get_8bit_row;
      break;
    case 24:
      source->pub.get_pixel_rows = get_24bit_row;
      break;
    case 32:
      source->pub.get_pixel_rows = get_32bit_row;
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
    }
  }

  /* Ensure that biWidth * cinfo->input_components doesn't exceed the maximum
     value of the JDIMENSION type.  This is only a danger with BMP files, since
     their width and height fields are 32-bit integers. */
  if ((unsigned long long)biWidth *
      (unsigned long long)cinfo->input_components > 0xFFFFFFFFULL)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  /* Allocate one-row buffer for returned data */
  source->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)biWidth * (JDIMENSION)cinfo->input_components, (JDIMENSION)1);
  source->pub.buffer_height = 1;

  cinfo->data_precision = 8;
  cinfo->image_width = (JDIMENSION)biWidth;
  cinfo->image_height = (JDIMENSION)biHeight;
}